

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlDOMWrapNSNormAddNsMapItem2
              (xmlNsPtr **list,int *size,int *number,xmlNsPtr oldNs,xmlNsPtr newNs)

{
  uint uVar1;
  xmlNsPtr *ppxVar2;
  uint uVar3;
  int iVar4;
  
  iVar4 = *number;
  uVar1 = *size;
  if (iVar4 < (int)uVar1) {
    ppxVar2 = *list;
  }
  else {
    if ((int)uVar1 < 1) {
      iVar4 = 3;
    }
    else {
      if (999999999 < uVar1) {
        return -1;
      }
      uVar3 = uVar1 + 1 >> 1;
      iVar4 = uVar3 + uVar1;
      if (1000000000 - uVar3 < uVar1) {
        iVar4 = 1000000000;
      }
    }
    ppxVar2 = (xmlNsPtr *)(*xmlRealloc)(*list,(ulong)(uint)(iVar4 * 2) << 3);
    if (ppxVar2 == (xmlNsPtr *)0x0) {
      return -1;
    }
    *list = ppxVar2;
    *size = iVar4;
    iVar4 = *number;
  }
  ppxVar2[iVar4 * 2] = oldNs;
  (*list)[iVar4 * 2 + 1] = newNs;
  *number = iVar4 + 1;
  return 0;
}

Assistant:

static int
xmlDOMWrapNSNormAddNsMapItem2(xmlNsPtr **list, int *size, int *number,
			xmlNsPtr oldNs, xmlNsPtr newNs)
{
    if (*number >= *size) {
        xmlNsPtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(*size, 2 * sizeof(tmp[0]), 3, XML_MAX_ITEMS);
        if (newSize < 0)
            return(-1);
        tmp = xmlRealloc(*list, newSize * 2 * sizeof(tmp[0]));
        if (tmp == NULL)
            return(-1);
        *list = tmp;
        *size = newSize;
    }

    (*list)[2 * (*number)] = oldNs;
    (*list)[2 * (*number) +1] = newNs;
    (*number)++;
    return (0);
}